

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_9::DiskHandle::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,DiskHandle *this)

{
  char *pcVar1;
  size_t sVar2;
  Array<kj::ReadableDirectory::Entry> *pAVar3;
  bool bVar4;
  int iVar5;
  int osErrorNumber;
  Type TVar6;
  __off64_t _Var7;
  DIR *__dirp;
  int *piVar8;
  dirent64 *pdVar9;
  size_t sVar10;
  ArrayBuilder<kj::ReadableDirectory::Entry> *pAVar11;
  Array<char> *this_00;
  StringPtr value;
  StringPtr value_00;
  StringPtr name;
  DIR *dir;
  Fault f_4;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:687:5)>
  _kjDefer687;
  Vector<kj::ReadableDirectory::Entry> entries;
  Fault f;
  ArrayPtr<const_char> local_148;
  DIR *local_138;
  Entry local_130;
  Array<kj::ReadableDirectory::Entry> *local_110;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:687:5)>
  local_108;
  ArrayBuilder<kj::ReadableDirectory::Entry> local_f8;
  StringPtr local_d0;
  undefined1 local_c0 [24];
  mode_t local_a8;
  
  do {
    _Var7 = lseek64((this->fd).fd,0,0);
    if (-1 < _Var7) goto LAB_0041b9d4;
    iVar5 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2a3,iVar5,"lseek(fd, 0, SEEK_SET)","");
    kj::_::Debug::Fault::fatal((Fault *)local_c0);
  }
LAB_0041b9d4:
  do {
    iVar5 = dup((this->fd).fd);
    if (-1 < iVar5) goto LAB_0041b9f6;
    osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2a8,osErrorNumber,"duped = dup(fd)","");
    kj::_::Debug::Fault::fatal((Fault *)local_c0);
  }
LAB_0041b9f6:
  local_110 = __return_storage_ptr__;
  __dirp = fdopendir(iVar5);
  local_138 = __dirp;
  if (__dirp == (DIR *)0x0) {
    close(iVar5);
    piVar8 = __errno_location();
    kj::_::Debug::Fault::Fault
              ((Fault *)local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2ac,*piVar8,"fdopendir","");
    kj::_::Debug::Fault::fatal((Fault *)local_c0);
  }
  local_108.maybeFunc.ptr.isSet = true;
  local_108.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:687:5)>_2
        )&local_138;
  pAVar11 = &local_f8;
  local_f8.endPtr = (Entry *)0x0;
  local_f8.ptr = (Entry *)0x0;
  local_f8.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
  local_f8.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  piVar8 = __errno_location();
  do {
    do {
      do {
        do {
          *piVar8 = 0;
          pdVar9 = readdir64(__dirp);
          pAVar3 = local_110;
          if (pdVar9 == (dirent64 *)0x0) {
            if (*piVar8 != 0) {
              kj::_::Debug::Fault::Fault
                        ((Fault *)local_c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                         ,699,*piVar8,"readdir","");
              kj::_::Debug::Fault::fatal((Fault *)local_c0);
            }
            Vector<kj::ReadableDirectory::Entry>::releaseAsArray
                      (local_110,(Vector<kj::ReadableDirectory::Entry> *)&local_f8);
            std::__sort<kj::ReadableDirectory::Entry*,__gnu_cxx::__ops::_Iter_less_iter>
                      (pAVar3->ptr,pAVar3->ptr + pAVar3->size_);
            ArrayBuilder<kj::ReadableDirectory::Entry>::dispose(&local_f8);
            kj::_::
            Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++:687:5)>
            ::~Deferred(&local_108);
            return pAVar3;
          }
          sVar10 = strlen(pdVar9->d_name);
          local_148.size_ = sVar10 + 1;
          local_c0._0_8_ = ".";
          local_c0._8_8_ = 2;
          local_148.ptr = pdVar9->d_name;
          bVar4 = ArrayPtr<const_char>::operator==(&local_148,(ArrayPtr<const_char> *)local_c0);
          __dirp = local_138;
        } while (bVar4);
        local_130._0_8_ = "..";
        local_130.name.content.ptr = (char *)0x3;
        bVar4 = ArrayPtr<const_char>::operator==(&local_148,(ArrayPtr<const_char> *)&local_130);
        __dirp = local_138;
      } while (bVar4);
      local_d0.content.ptr = ".kj-tmp.";
      local_d0.content.size_ = 9;
      bVar4 = StringPtr::startsWith((StringPtr *)&local_148,&local_d0);
      sVar2 = local_148.size_;
      pcVar1 = local_148.ptr;
      __dirp = local_138;
    } while (bVar4);
    if (pdVar9->d_type == 0) {
      do {
        pAVar11 = (ArrayBuilder<kj::ReadableDirectory::Entry> *)0x100;
        iVar5 = fstatat64((this->fd).fd,local_148.ptr,(stat64 *)local_c0,0x100);
        if (-1 < iVar5) goto LAB_0041bb7c;
        iVar5 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar5 == -1);
      if (iVar5 != 0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x2c9,iVar5,"fstatat(fd, name.cStr(), &stats, AT_SYMLINK_NOFOLLOW)","");
        kj::_::Debug::Fault::fatal((Fault *)&local_130);
      }
LAB_0041bb7c:
      sVar2 = local_148.size_;
      pcVar1 = local_148.ptr;
      TVar6 = modeToType(local_a8);
      local_130.type = TVar6;
      value_00.content.size_ = (size_t)pAVar11;
      value_00.content.ptr = (char *)sVar2;
      heapString(&local_130.name,(kj *)pcVar1,value_00);
      Vector<kj::ReadableDirectory::Entry>::add<kj::ReadableDirectory::Entry>
                ((Vector<kj::ReadableDirectory::Entry> *)&local_f8,&local_130);
      this_00 = &local_130.name.content;
    }
    else {
      TVar6 = modeToType((uint)pdVar9->d_type << 0xc);
      local_c0._0_4_ = TVar6;
      value.content.size_ = (size_t)pAVar11;
      value.content.ptr = (char *)sVar2;
      heapString((String *)(local_c0 + 8),(kj *)pcVar1,value);
      Vector<kj::ReadableDirectory::Entry>::add<kj::ReadableDirectory::Entry>
                ((Vector<kj::ReadableDirectory::Entry> *)&local_f8,(Entry *)local_c0);
      this_00 = (Array<char> *)(local_c0 + 8);
    }
    Array<char>::~Array(this_00);
    __dirp = local_138;
  } while( true );
}

Assistant:

Array<ReadableDirectory::Entry> listEntries() const {
    return list(true, [](StringPtr name, FsNode::Type type) {
      return ReadableDirectory::Entry { type, heapString(name), };
    });
  }